

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O3

void __thiscall TPZPrInteg<TPZInt1d>::GetOrder(TPZPrInteg<TPZInt1d> *this,TPZVec<int> *ord)

{
  int *piVar1;
  
  if (ord->fNElements < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZPrInteg::GetOrder: number of integration points specified smaller than dimension\n"
               ,0x54);
    return;
  }
  piVar1 = ord->fStore;
  *piVar1 = (this->super_TPZInt1d).fOrdKsi;
  piVar1[1] = this->fOrdKsi;
  return;
}

Assistant:

void GetOrder(TPZVec<int> &ord) const override
    {
#ifndef PZNODEBUG
		if(ord.NElements() < Dim) {
			std::cout << "TPZPrInteg::GetOrder: number of integration points specified smaller than dimension\n";
			return;
		}
#endif
		TFather::GetOrder(ord);
		ord[Dim-1] = fOrdKsi;
    }